

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

bool libcellml::hasComponentImports(ComponentEntityConstPtr *componentEntity)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  ComponentPtr childComponent;
  ComponentEntity local_50;
  ComponentEntityConstPtr local_40;
  
  sVar2 = ComponentEntity::componentCount
                    ((componentEntity->
                     super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr);
  if (sVar2 == 0) {
    bVar1 = false;
  }
  else {
    uVar3 = 1;
    do {
      ComponentEntity::component
                (&local_50,
                 (size_t)(componentEntity->
                         super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr);
      bVar1 = ImportedEntity::isImport
                        ((ImportedEntity *)
                         ((long)local_50.super_NamedEntity.super_ParentedEntity.super_Entity.
                                _vptr_Entity + 0x10));
      if (!bVar1) {
        local_40.super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)
                 local_50.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
        local_40.super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
                 *(_Atomic_word *)
                  ((long)local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) +
                 1;
          }
        }
        bVar1 = hasComponentImports(&local_40);
        if (local_40.
            super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.
                     super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_50.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
      }
      sVar2 = ComponentEntity::componentCount
                        ((componentEntity->
                         super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr);
      bVar4 = uVar3 < sVar2;
      uVar3 = uVar3 + 1;
    } while (bVar4 && bVar1 == false);
  }
  return bVar1;
}

Assistant:

bool hasComponentImports(const ComponentEntityConstPtr &componentEntity)
{
    bool importsPresent = false;
    for (size_t index = 0; (index < componentEntity->componentCount()) && !importsPresent; ++index) {
        libcellml::ComponentPtr childComponent = componentEntity->component(index);
        importsPresent = childComponent->isImport();
        if (!importsPresent) {
            importsPresent = hasComponentImports(childComponent);
        }
    }
    return importsPresent;
}